

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstantExecution.h
# Opt level: O2

void nrg::InstantExecution::push<void(*)()>(Queue *queue,_func_void *fn)

{
  function<void_()> fStack_48;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/InstantExecution.h:51:29)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/norinrg[P]executor/./executor/InstantExecution.h:51:29)>
             ::_M_manager;
  local_28._M_unused._M_function_pointer = fn;
  std::function<void_()>::function(&fStack_48,(function<void_()> *)&local_28);
  std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)queue,&fStack_48)
  ;
  std::_Function_base::~_Function_base(&fStack_48.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = [=]() { fn(param...); };
        push(queue, elem);
    }